

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O3

Path * __thiscall
RuntimeObjectSystem::FindFile
          (Path *__return_storage_ptr__,RuntimeObjectSystem *this,Path *input,bool *pFound)

{
  string *psVar1;
  string *psVar2;
  size_type sVar3;
  pointer pcVar4;
  ICompilerLogger *pIVar5;
  undefined8 uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  char *__s;
  long lVar11;
  iterator iVar12;
  mapped_type *pmVar13;
  char cVar14;
  bool bVar15;
  bool bVar16;
  Path currPath;
  Path requestedDirectory;
  Path currPath_1;
  Path directory;
  Path *foundFile;
  Path checkFromCurrentDir;
  TFileList requestedSubPaths;
  Path directory_1;
  Path existingPath;
  Path filename;
  Path toCheck;
  undefined1 local_248 [144];
  undefined1 local_1b8 [8];
  _Alloc_hider local_1b0;
  size_type local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Base_ptr local_190;
  undefined1 local_188 [8];
  _Alloc_hider local_180;
  char *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  undefined1 local_160 [8];
  _Alloc_hider local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  Path *local_138;
  _Base_ptr local_130;
  TFileMap *local_128;
  undefined1 local_120 [8];
  _Alloc_hider local_118;
  char *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_> local_f8;
  undefined1 local_e0 [8];
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  undefined1 local_b8 [8];
  _Alloc_hider local_b0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  undefined1 local_90 [8];
  _Alloc_hider local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  Path local_68;
  string *local_40;
  bool *local_38;
  
  pcVar10 = (input->m_string)._M_dataplus._M_p;
  sVar3 = (input->m_string)._M_string_length;
  if (sVar3 == 0) {
    bVar16 = true;
  }
  else {
    bVar16 = *pcVar10 != '/';
  }
  local_1b8 = (undefined1  [8])&PTR__Path_00119a10;
  local_1b0._M_p = (pointer)&local_1a0;
  local_138 = __return_storage_ptr__;
  local_38 = pFound;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1b0,pcVar10,pcVar10 + sVar3);
  local_88._M_p = (pointer)&local_78;
  local_90 = (undefined1  [8])&PTR__Path_00119a10;
  local_80 = 0;
  local_78._M_local_buf[0] = '\0';
  local_138->_vptr_Path = (_func_int **)&PTR__Path_00119a10;
  psVar1 = &local_138->m_string;
  (local_138->m_string)._M_dataplus._M_p = (pointer)&(local_138->m_string).field_2;
  pcVar4 = (input->m_string)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar1,pcVar4,pcVar4 + (input->m_string)._M_string_length);
  psVar2 = &input->m_string;
  cVar14 = (char)psVar2;
  uVar8 = std::__cxx11::string::rfind(cVar14,0x2e);
  if (((uVar8 != 0xffffffffffffffff) &&
      (uVar9 = std::__cxx11::string::rfind(cVar14,0x2f),
      uVar9 == 0xffffffffffffffff || uVar9 <= uVar8)) &&
     (uVar9 = std::__cxx11::string::rfind(cVar14,0x5c),
     uVar9 == 0xffffffffffffffff || uVar9 <= uVar8)) {
    FileSystemUtils::Path::ParentPath((Path *)local_248,(Path *)local_1b8);
    std::__cxx11::string::_M_assign((string *)&local_1b0);
    local_248._0_8_ = &PTR__Path_00119a10;
    if ((undefined1 *)local_248._8_8_ != local_248 + 0x18) {
      operator_delete((void *)local_248._8_8_,CONCAT71(local_248._25_7_,local_248[0x18]) + 1);
    }
    FileSystemUtils::Path::Filename((Path *)local_248,input);
    std::__cxx11::string::_M_assign((string *)&local_88);
    local_248._0_8_ = &PTR__Path_00119a10;
    if ((undefined1 *)local_248._8_8_ != local_248 + 0x18) {
      operator_delete((void *)local_248._8_8_,CONCAT71(local_248._25_7_,local_248[0x18]) + 1);
    }
  }
  local_40 = psVar2;
  if (bVar16) {
    local_248._0_8_ = &PTR__Path_00119a10;
    pcVar4 = local_248 + 0x18;
    local_248._16_8_ = (char *)0x0;
    local_248[0x18] = '\0';
    local_248._8_8_ = pcVar4;
    pcVar10 = getcwd((char *)0x0,0);
    uVar6 = local_248._16_8_;
    strlen(pcVar10);
    std::__cxx11::string::_M_replace((ulong)(local_248 + 8),0,(char *)uVar6,(ulong)pcVar10);
    free(pcVar10);
    FileSystemUtils::operator/((Path *)local_120,(Path *)local_248,input);
    local_248._0_8_ = &PTR__Path_00119a10;
    if ((pointer)local_248._8_8_ != pcVar4) {
      operator_delete((void *)local_248._8_8_,CONCAT71(local_248._25_7_,local_248[0x18]) + 1);
    }
    iVar7 = stat(local_118._M_p,(stat *)local_248);
    if (iVar7 == 0) {
      std::__cxx11::string::_M_assign((string *)psVar1);
      local_188 = (undefined1  [8])&PTR__Path_00119a10;
      local_178 = (char *)0x0;
      local_170._M_local_buf[0] = '\0';
      local_180._M_p = (pointer)&local_170;
      __s = getcwd((char *)0x0,0);
      pcVar10 = local_178;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&local_180,0,pcVar10,(ulong)__s);
      free(__s);
      FileSystemUtils::operator/((Path *)local_248,(Path *)local_188,(Path *)local_1b8);
      std::__cxx11::string::_M_assign((string *)&local_1b0);
      local_248._0_8_ = &PTR__Path_00119a10;
      if ((pointer)local_248._8_8_ != pcVar4) {
        operator_delete((void *)local_248._8_8_,CONCAT71(local_248._25_7_,local_248[0x18]) + 1);
      }
      local_188 = (undefined1  [8])&PTR__Path_00119a10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_p != &local_170) {
        operator_delete(local_180._M_p,
                        CONCAT71(local_170._M_allocated_capacity._1_7_,local_170._M_local_buf[0]) +
                        1);
      }
    }
    local_120 = (undefined1  [8])&PTR__Path_00119a10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_p != &local_108) {
      operator_delete(local_118._M_p,local_108._M_allocated_capacity + 1);
    }
  }
  iVar7 = stat(local_1b0._M_p,(stat *)local_248);
  if (iVar7 == 0) {
    pmVar13 = std::
              map<FileSystemUtils::Path,_FileSystemUtils::Path,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
              ::operator[](&this->m_FoundSourceDirectoryMappings,(key_type *)local_1b8);
    std::__cxx11::string::_M_assign((string *)&pmVar13->m_string);
    goto LAB_0010eede;
  }
  if ((this->m_FoundSourceDirectoryMappings)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)
  goto LAB_0010eede;
  local_120 = (undefined1  [8])&PTR__Path_00119a10;
  local_118._M_p = (pointer)&local_108;
  local_128 = &this->m_FoundSourceDirectoryMappings;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,local_1b0._M_p,local_1b0._M_p + local_1a8);
  local_188 = (undefined1  [8])&PTR__Path_00119a10;
  local_180._M_p = (pointer)&local_170;
  local_178 = (char *)0x0;
  local_170._M_local_buf[0] = '\0';
  local_130 = &(this->m_FoundSourceDirectoryMappings)._M_t._M_impl.super__Rb_tree_header._M_header;
  iVar7 = 0;
  while( true ) {
    cVar14 = (char)(string *)&local_118;
    lVar11 = std::__cxx11::string::rfind(cVar14,0x2f);
    if ((0xfffffffffffffffd < lVar11 - 1U) &&
       (lVar11 = std::__cxx11::string::rfind(cVar14,0x5c), 0xfffffffffffffffd < lVar11 - 1U)) {
      bVar16 = false;
      goto LAB_0010e967;
    }
    iVar12 = std::
             _Rb_tree<FileSystemUtils::Path,_std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>,_std::_Select1st<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
             ::find(&local_128->_M_t,(key_type *)local_120);
    if (iVar12._M_node != local_130) break;
    FileSystemUtils::Path::ParentPath((Path *)local_248,(key_type *)local_120);
    std::__cxx11::string::_M_assign((string *)&local_118);
    local_248._0_8_ = &PTR__Path_00119a10;
    if ((undefined1 *)local_248._8_8_ != local_248 + 0x18) {
      operator_delete((void *)local_248._8_8_,CONCAT71(local_248._25_7_,local_248[0x18]) + 1);
    }
    iVar7 = iVar7 + -1;
  }
  std::__cxx11::string::_M_assign((string *)&local_180);
  if (iVar7 == 0) {
    FileSystemUtils::operator/((Path *)local_248,(Path *)local_188,(Path *)local_90);
    std::__cxx11::string::_M_assign((string *)psVar1);
    local_248._0_8_ = &PTR__Path_00119a10;
    if ((undefined1 *)local_248._8_8_ != local_248 + 0x18) {
      operator_delete((void *)local_248._8_8_,CONCAT71(local_248._25_7_,local_248[0x18]) + 1);
    }
  }
  else {
    local_160 = (undefined1  [8])&PTR__Path_00119a10;
    local_158._M_p = (pointer)&local_148;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,local_1b0._M_p,local_1b0._M_p + local_1a8);
    std::__cxx11::string::replace((ulong)&local_158,0,local_110,(ulong)local_180._M_p);
    iVar7 = stat(local_158._M_p,(stat *)local_248);
    if (iVar7 == 0) {
      FileSystemUtils::operator/((Path *)local_248,(Path *)local_160,(Path *)local_90);
      std::__cxx11::string::_M_assign((string *)psVar1);
      local_248._0_8_ = &PTR__Path_00119a10;
      if ((undefined1 *)local_248._8_8_ != local_248 + 0x18) {
        operator_delete((void *)local_248._8_8_,CONCAT71(local_248._25_7_,local_248[0x18]) + 1);
      }
      iVar7 = stat((psVar1->_M_dataplus)._M_p,(stat *)local_248);
      if (iVar7 != 0) goto LAB_0010e926;
      pmVar13 = std::
                map<FileSystemUtils::Path,_FileSystemUtils::Path,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
                ::operator[](local_128,(key_type *)local_1b8);
      std::__cxx11::string::_M_assign((string *)&pmVar13->m_string);
      pIVar5 = this->m_pCompilerLogger;
      bVar16 = true;
      if (pIVar5 != (ICompilerLogger *)0x0) {
        (**(code **)(*(long *)pIVar5 + 0x10))
                  (pIVar5,"Found Directory Mapping: %s to %s\n",local_1b0._M_p,local_158._M_p);
      }
    }
    else {
LAB_0010e926:
      bVar16 = false;
    }
    local_160 = (undefined1  [8])&PTR__Path_00119a10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_p != &local_148) {
      operator_delete(local_158._M_p,local_148._M_allocated_capacity + 1);
    }
    if (!bVar16) {
LAB_0010e967:
      local_f8.super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_f8.super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f8.super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_160 = (undefined1  [8])&PTR__Path_00119a10;
      local_158._M_p = (pointer)&local_148;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_158,local_1b0._M_p,local_1b0._M_p + local_1a8);
      while( true ) {
        cVar14 = (char)(string *)&local_158;
        lVar11 = std::__cxx11::string::rfind(cVar14,0x2f);
        if ((0xfffffffffffffffd < lVar11 - 1U) &&
           (lVar11 = std::__cxx11::string::rfind(cVar14,0x5c), 0xfffffffffffffffd < lVar11 - 1U))
        break;
        std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::push_back
                  (&local_f8,(value_type *)local_160);
        FileSystemUtils::Path::ParentPath((Path *)local_248,(value_type *)local_160);
        std::__cxx11::string::_M_assign((string *)&local_158);
        local_248._0_8_ = &PTR__Path_00119a10;
        if ((undefined1 *)local_248._8_8_ != local_248 + 0x18) {
          operator_delete((void *)local_248._8_8_,CONCAT71(local_248._25_7_,local_248[0x18]) + 1);
        }
      }
      local_190 = (this->m_FoundSourceDirectoryMappings)._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
      if (local_190 != local_130 && !bVar16) {
        do {
          local_b8 = (undefined1  [8])&PTR__Path_00119a10;
          local_b0[0]._M_p = (pointer)&local_a0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_b0,local_190[2]._M_left,
                     (long)&(local_190[2]._M_left)->_M_color +
                     (long)&(local_190[2]._M_right)->_M_color);
          while( true ) {
            lVar11 = std::__cxx11::string::rfind((char)local_b0,0x2f);
            if (lVar11 - 1U < 0xfffffffffffffffe) {
              bVar15 = false;
            }
            else {
              lVar11 = std::__cxx11::string::rfind((char)local_b0,0x5c);
              bVar15 = lVar11 + 1U < 2;
            }
            if ((bVar15) || (bVar16)) break;
            if (local_f8.
                super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                local_f8.
                super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              lVar11 = 0;
              uVar8 = 0;
              do {
                FileSystemUtils::Path::Filename
                          ((Path *)local_248,
                           (Path *)((long)&(local_f8.
                                            super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_vptr_Path +
                                   lVar11));
                FileSystemUtils::operator/(&local_68,(Path *)local_b8,(Path *)local_248);
                local_248._0_8_ = &PTR__Path_00119a10;
                if ((undefined1 *)local_248._8_8_ != local_248 + 0x18) {
                  operator_delete((void *)local_248._8_8_,
                                  CONCAT71(local_248._25_7_,local_248[0x18]) + 1);
                }
                iVar7 = stat(local_68.m_string._M_dataplus._M_p,(stat *)local_248);
                bVar15 = true;
                if (iVar7 == 0) {
                  local_e0 = (undefined1  [8])&PTR__Path_00119a10;
                  local_d8._M_p = (pointer)&local_c8;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_d8,local_1b0._M_p,local_1b0._M_p + local_1a8);
                  std::__cxx11::string::replace
                            ((ulong)&local_d8,0,
                             *(char **)((long)&((local_f8.
                                                 super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               m_string)._M_string_length + lVar11),
                             (ulong)local_68.m_string._M_dataplus._M_p);
                  iVar7 = stat(local_d8._M_p,(stat *)local_248);
                  bVar15 = true;
                  if (iVar7 == 0) {
                    FileSystemUtils::operator/((Path *)local_248,(Path *)local_e0,(Path *)local_90);
                    std::__cxx11::string::_M_assign((string *)psVar1);
                    local_248._0_8_ = &PTR__Path_00119a10;
                    if ((undefined1 *)local_248._8_8_ != local_248 + 0x18) {
                      operator_delete((void *)local_248._8_8_,
                                      CONCAT71(local_248._25_7_,local_248[0x18]) + 1);
                    }
                    iVar7 = stat((psVar1->_M_dataplus)._M_p,(stat *)local_248);
                    if (iVar7 == 0) {
                      pmVar13 = std::
                                map<FileSystemUtils::Path,_FileSystemUtils::Path,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
                                ::operator[](local_128,(key_type *)local_1b8);
                      std::__cxx11::string::_M_assign((string *)&pmVar13->m_string);
                      pIVar5 = this->m_pCompilerLogger;
                      bVar16 = true;
                      if (pIVar5 == (ICompilerLogger *)0x0) {
                        bVar15 = false;
                      }
                      else {
                        bVar15 = false;
                        (**(code **)(*(long *)pIVar5 + 0x10))
                                  (pIVar5,"Found Directory Mapping: %s to %s\n",local_1b0._M_p,
                                   local_d8._M_p);
                      }
                    }
                  }
                  local_e0 = (undefined1  [8])&PTR__Path_00119a10;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_d8._M_p != &local_c8) {
                    operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
                  }
                }
                local_68._vptr_Path = (_func_int **)&PTR__Path_00119a10;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68.m_string._M_dataplus._M_p != &local_68.m_string.field_2) {
                  operator_delete(local_68.m_string._M_dataplus._M_p,
                                  local_68.m_string.field_2._M_allocated_capacity + 1);
                }
                if (!bVar15) break;
                uVar8 = uVar8 + 1;
                lVar11 = lVar11 + 0x28;
              } while (uVar8 < (ulong)(((long)local_f8.
                                              super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_f8.
                                              super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                      -0x3333333333333333));
            }
            FileSystemUtils::Path::ParentPath((Path *)local_248,(Path *)local_b8);
            std::__cxx11::string::_M_assign((string *)local_b0);
            local_248._0_8_ = &PTR__Path_00119a10;
            if ((undefined1 *)local_248._8_8_ != local_248 + 0x18) {
              operator_delete((void *)local_248._8_8_,CONCAT71(local_248._25_7_,local_248[0x18]) + 1
                             );
            }
          }
          local_190 = (_Base_ptr)std::_Rb_tree_increment(local_190);
          local_b8 = (undefined1  [8])&PTR__Path_00119a10;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0[0]._M_p != &local_a0) {
            operator_delete(local_b0[0]._M_p,local_a0._M_allocated_capacity + 1);
          }
        } while ((local_190 != local_130) && (!bVar16));
      }
      local_160 = (undefined1  [8])&PTR__Path_00119a10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_p != &local_148) {
        operator_delete(local_158._M_p,local_148._M_allocated_capacity + 1);
      }
      std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::~vector(&local_f8)
      ;
    }
  }
  local_188 = (undefined1  [8])&PTR__Path_00119a10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != &local_170) {
    operator_delete(local_180._M_p,
                    CONCAT71(local_170._M_allocated_capacity._1_7_,local_170._M_local_buf[0]) + 1);
  }
  local_120 = (undefined1  [8])&PTR__Path_00119a10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_p != &local_108) {
    operator_delete(local_118._M_p,local_108._M_allocated_capacity + 1);
  }
LAB_0010eede:
  iVar7 = stat((psVar1->_M_dataplus)._M_p,(stat *)local_248);
  if (local_38 != (bool *)0x0) {
    *local_38 = iVar7 == 0;
  }
  if ((iVar7 != 0) && (pIVar5 = this->m_pCompilerLogger, pIVar5 != (ICompilerLogger *)0x0)) {
    (**(code **)(*(long *)pIVar5 + 8))
              (pIVar5,"Could not find Directory Mapping for: %s\n",(local_40->_M_dataplus)._M_p);
  }
  local_90 = (undefined1  [8])&PTR__Path_00119a10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_p != &local_78) {
    operator_delete(local_88._M_p,
                    CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]) + 1);
  }
  local_1b8 = (undefined1  [8])&PTR__Path_00119a10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_p != &local_1a0) {
    operator_delete(local_1b0._M_p,local_1a0._M_allocated_capacity + 1);
  }
  return local_138;
}

Assistant:

FileSystemUtils::Path RuntimeObjectSystem::FindFile( const FileSystemUtils::Path& input, bool* pFound )
{
    // we want absolute paths, but path might be relative - do a quick check:
    bool bMaybeRelative = true;
    #ifdef _WIN32
        // Note: C:MyDir is actually a relative path but we do not handle these as unlikely to be produced by __FILE__ input
        if( input.m_string.size() >= 1 )
        {
            if( input.m_string[0] == '\\' )
            {
                bMaybeRelative = false;
            }
            else if( input.m_string.size() >= 2 && input.m_string[1] == ':' )
            {
                bMaybeRelative = false;
            }
        }
    #else
        if( input.m_string.size() >= 1 )
        {
            if( input.m_string[0] == '/' )
            {
                bMaybeRelative = false;
            }
        }
    #endif


    FileSystemUtils::Path requestedDirectory = input;
    FileSystemUtils::Path filename;
    FileSystemUtils::Path foundFile = input;
    bool bIsFile = input.HasExtension();
    if( bIsFile )
    {
        requestedDirectory = requestedDirectory.ParentPath();
        filename = input.Filename();
    }

    if( bMaybeRelative )
    {
        // Test with input path as it might be just a file name, leading to empty requestedDirectory
        // which would always match current dir.
        FileSystemUtils::Path checkFromCurrentDir = FileSystemUtils::GetCurrentPath() / input;
        if( checkFromCurrentDir.Exists() )
        {
            foundFile = checkFromCurrentDir;
            requestedDirectory = FileSystemUtils::GetCurrentPath() / requestedDirectory;
        }
    }

    requestedDirectory.ToOSCanonicalCase();
    filename.ToOSCanonicalCase();
    foundFile.ToOSCanonicalCase();

    // Step 1: Try input directory
    if( requestedDirectory.Exists() )
    {
        m_FoundSourceDirectoryMappings[ requestedDirectory ] = requestedDirectory;
    }
    else
    {
        // Step 2: Attempt to find a pre-existing mapping
        bool bFoundMapping = false;
        if( m_FoundSourceDirectoryMappings.size() )
        {
            FileSystemUtils::Path testDir = requestedDirectory;
            FileSystemUtils::Path foundDir;
            unsigned int depth = 0;
            bool bFound = false;
            while( testDir.HasParentPath() )
            {
                TFileMapIterator itrFind = m_FoundSourceDirectoryMappings.find( testDir );
                if( itrFind != m_FoundSourceDirectoryMappings.end() )
                {
                    foundDir = itrFind->second;
                    bFound = true;
                    break;
                }

                testDir = testDir.ParentPath();
                ++depth;
            }

            if( bFound )
            {
                if( depth )
                {
                    // not an exact match
                    FileSystemUtils::Path directory = requestedDirectory;
                    directory.m_string.replace( 0, testDir.m_string.length(), foundDir.m_string );
                    if( directory.Exists() )
                    {
                        foundFile = directory / filename;
                        if( foundFile.Exists() )
                        {
                            m_FoundSourceDirectoryMappings[ requestedDirectory ] = directory;
                            if( m_pCompilerLogger ) {  m_pCompilerLogger->LogInfo( "Found Directory Mapping: %s to %s\n", requestedDirectory.c_str(), directory.c_str() ); }
                            bFoundMapping = true;
                        }
                    }

                }
                else
                {
                    // exact match
                    foundFile = foundDir / filename;
                    bFoundMapping = true;
                }
            }
            
            if( !bFoundMapping )
            {
                // Step 3: Attempt to find a mapping from a known path
                TFileList requestedSubPaths;
                FileSystemUtils::Path requestedSubPath = requestedDirectory;
                while( requestedSubPath.HasParentPath() )
                {
                    requestedSubPaths.push_back( requestedSubPath );
                    requestedSubPath = requestedSubPath.ParentPath();
                }

                TFileMapIterator itr = m_FoundSourceDirectoryMappings.begin();
                while( ( itr != m_FoundSourceDirectoryMappings.end() ) && !bFoundMapping )
                {
                    FileSystemUtils::Path existingPath = itr->second;
                    while( ( existingPath.HasParentPath() ) && !bFoundMapping )
                    {
                        // check all potentials
                        for( size_t i=0; i<requestedSubPaths.size(); ++i )
                        {
                            FileSystemUtils::Path toCheck = existingPath / requestedSubPaths[i].Filename();
                            if( toCheck.Exists() )
                            {
                                // potential mapping
                                FileSystemUtils::Path directory = requestedDirectory;
                                directory.m_string.replace( 0, requestedSubPaths[i].m_string.length(), toCheck.m_string );
                                if( directory.Exists() )
                                {
                                    foundFile = directory / filename;
                                    if( foundFile.Exists() )
                                    {
                                        m_FoundSourceDirectoryMappings[ requestedDirectory ] = directory;
                                        if( m_pCompilerLogger ) {  m_pCompilerLogger->LogInfo( "Found Directory Mapping: %s to %s\n", requestedDirectory.c_str(), directory.c_str() ); }
                                        bFoundMapping = true;
                                        break;
                                    }
                                }
                            }
                        }
                        existingPath = existingPath.ParentPath();
                    }
                    ++itr;
                }
            }
        }

        foundFile.ToOSCanonicalCase();
    }

    bool bFound = foundFile.Exists();
    if( pFound )
    {
        *pFound = bFound;
    }
    if( !bFound )
    {
        if( m_pCompilerLogger ) {  m_pCompilerLogger->LogWarning( "Could not find Directory Mapping for: %s\n", input.c_str() ); }
    }
    return foundFile;
}